

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanNumber
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  bool bVar1;
  BOOL BVar2;
  char16_t *psz;
  bool bVar3;
  double value;
  double val;
  char16 *start;
  char16 *end;
  LikelyNumberType likelyint;
  char16 c;
  List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *charList_local;
  TextFormatReader *this_local;
  
  end._6_2_ = 0;
  _likelyint = charList;
  charList_local =
       (List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)this;
  while( true ) {
    bVar1 = FileReader::PeekRawChar(&this->super_FileReader,(char16 *)((long)&end + 6));
    bVar3 = false;
    if ((bVar1) && ((end._6_2_ < 0x30 || (bVar3 = true, 0x39 < end._6_2_)))) {
      bVar3 = end._6_2_ == 0x2e;
    }
    if (!bVar3) break;
    FileReader::ReadRawChar(&this->super_FileReader,(char16 *)((long)&end + 6));
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (_likelyint,(char16_t *)((long)&end + 6));
  }
  end._4_2_ = 0;
  JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (_likelyint,(char16_t *)((long)&end + 4));
  psz = JsUtil::ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>::GetBuffer
                  (&_likelyint->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>
                  );
  value = Js::NumberUtilities::StrToDbl<char16_t>(psz,&start,(LikelyNumberType *)&end,false,false);
  if (psz == start) {
    this_local._4_4_ = Error;
  }
  else {
    BVar2 = Js::JavascriptNumber::IsNan(value);
    if (BVar2 != 0) {
      TTDAbort_unrecoverable_error("Bad result from string to double conversion");
    }
    this_local._4_4_ = Number;
  }
  return this_local._4_4_;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanNumber(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        while(this->PeekRawChar(&c) && ((_u('0') <= c && c <= _u('9')) || (c == _u('.'))))
        {
            this->ReadRawChar(&c);
            charList.Add(c);
        }

        // Null-terminate the list before we try to use the buffer as a string.
        charList.Add(_u('\0'));

        LikelyNumberType likelyint; //we don't care about this just want to know that it is convertable to a number
        const char16* end;
        const char16* start = charList.GetBuffer();
        double val = Js::NumberUtilities::StrToDbl<char16>(start, &end, likelyint);
        if(start == end)
        {
            return NSTokens::ParseTokenKind::Error;
        }
        TTDAssert(!Js::JavascriptNumber::IsNan(val), "Bad result from string to double conversion");

        return NSTokens::ParseTokenKind::Number;
    }